

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O0

int libpd_arraysize(char *name)

{
  t_symbol *s;
  _garray *x;
  _garray *garray;
  int retval;
  char *name_local;
  
  sys_lock();
  s = gensym(name);
  x = (_garray *)pd_findbyclass(s,garray_class);
  if (x == (_garray *)0x0) {
    sys_unlock();
    name_local._4_4_ = -1;
  }
  else {
    name_local._4_4_ = garray_npoints(x);
    sys_unlock();
  }
  return name_local._4_4_;
}

Assistant:

int libpd_arraysize(const char *name) {
  int retval;
  sys_lock();
  GETARRAY
  retval = garray_npoints(garray);
  sys_unlock();
  return retval;
}